

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

int AF_AActor_LineAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int iVar2;
  int flags;
  FTranslatedLineTarget *victim;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  PClassActor *pufftype;
  AActor *pAVar7;
  PClassActor *pPVar8;
  char *pcVar9;
  bool bVar10;
  double distance;
  int acdmg;
  void *local_60;
  void *local_58;
  double local_50;
  FName local_44;
  DAngle local_40;
  DAngle local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar7 = (AActor *)(param->field_0).field_1.a;
      if (pAVar7 != (AActor *)0x0) {
        if ((pAVar7->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          (pAVar7->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar7->super_DThinker).super_DObject.Class;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00416a6e;
        }
      }
      if (numparam == 1) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar9 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar9 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      if (numparam == 5) {
                        pcVar9 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          if (numparam < 7) {
                            pcVar9 = "(paramnum) < numparam";
                          }
                          else {
                            if (param[6].field_0.field_3.Type == '\x03') {
                              local_38.Degrees = (double)param[1].field_0.field_1.a;
                              pVVar1 = param + 2;
                              local_40.Degrees = (double)param[3].field_0.field_1.a;
                              iVar4 = param[4].field_0.i;
                              iVar2 = param[5].field_0.i;
                              if ((param[6].field_0.field_1.atag == 1) ||
                                 (param[6].field_0.field_1.a == (void *)0x0)) {
                                pufftype = (PClassActor *)param[6].field_0.field_1.a;
                                if ((pufftype != (PClassActor *)0x0) &&
                                   (pPVar8 = pufftype,
                                   pufftype != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                                  do {
                                    pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
                                    if (pPVar8 == (PClassActor *)AActor::RegistrationInfo.MyClass)
                                    break;
                                  } while (pPVar8 != (PClassActor *)0x0);
                                  if (pPVar8 == (PClassActor *)0x0) {
                                    pcVar9 = 
                                    "puffType == NULL || puffType->IsDescendantOf(RUNTIME_CLASS(AActor))"
                                    ;
                                    goto LAB_00416acb;
                                  }
                                }
                                if (numparam == 7) {
                                  pVVar6 = defaultparam->Array;
                                  if (defaultparam->Array[7].field_0.field_3.Type != '\0') {
                                    pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00416a8d:
                                    __assert_fail(pcVar9,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                                  ,0x11e2,
                                                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                                 );
                                  }
                                }
                                else {
                                  pVVar6 = param;
                                  if (param[7].field_0.field_3.Type != '\0') {
                                    pcVar9 = "(param[paramnum]).Type == REGT_INT";
                                    goto LAB_00416a8d;
                                  }
                                }
                                flags = pVVar6[7].field_0.i;
                                if (numparam < 9) {
                                  param = defaultparam->Array;
                                  if ((param[8].field_0.field_3.Type == '\x03') &&
                                     (param[8].field_0.field_1.atag == 0)) goto LAB_00416890;
                                  pcVar9 = 
                                  "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
                                  ;
                                }
                                else {
                                  if ((param[8].field_0.field_3.Type == '\x03') &&
                                     (param[8].field_0.field_1.atag == 0)) {
LAB_00416890:
                                    victim = (FTranslatedLineTarget *)param[8].field_0.field_1.a;
                                    distance = (pVVar1->field_0).f;
                                    if (pufftype == (PClassActor *)0x0) {
                                      local_60 = (void *)local_40.Degrees;
                                      local_58 = (void *)local_38.Degrees;
                                      local_50 = (pVVar1->field_0).f;
                                      pufftype = PClass::FindActor("BulletPuff");
                                      distance = local_50;
                                      local_38.Degrees = (double)local_58;
                                      local_40.Degrees = (double)local_60;
                                    }
                                    local_44.Index = iVar2;
                                    pAVar7 = P_LineAttack(pAVar7,&local_38,distance,&local_40,iVar4,
                                                          &local_44,pufftype,flags,victim,&acdmg);
                                    if (0 < numret) {
                                      VMReturn::SetPointer(ret,pAVar7,1);
                                    }
                                    if (1 < numret) {
                                      if (ret[1].RegType != '\0') {
                                        __assert_fail("RegType == REGT_INT",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                                  ,0x13f,"void VMReturn::SetInt(int)");
                                      }
                                      *(int *)ret[1].Location = acdmg;
                                      numret = 2;
                                    }
                                    return numret;
                                  }
                                  pcVar9 = 
                                  "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC"
                                  ;
                                }
                                __assert_fail(pcVar9,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                              ,0x11e3,
                                              "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                             );
                              }
                            }
                            pcVar9 = 
                            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                            ;
                          }
LAB_00416acb:
                          __assert_fail(pcVar9,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                        ,0x11e1,
                                        "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                        pcVar9 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar9,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                    ,0x11e0,
                                    "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar9 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar9,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                ,0x11df,
                                "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar9 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                            ,0x11de,
                            "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar9 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x11dd,
                        "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x11dc,
                    "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00416a6e:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x11db,
                "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, LineAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE(angle);
	PARAM_FLOAT(distance);
	PARAM_ANGLE(pitch);
	PARAM_INT(damage);
	PARAM_NAME(damageType);
	PARAM_CLASS(puffType, AActor);
	PARAM_INT_DEF(flags);
	PARAM_POINTER_DEF(victim, FTranslatedLineTarget);

	int acdmg;
	if (puffType == nullptr) puffType = PClass::FindActor("BulletPuff");	// P_LineAttack does not work without a puff to take info from.
	auto puff = P_LineAttack(self, angle, distance, pitch, damage, damageType, puffType, flags, victim, &acdmg);
	if (numret > 0) ret[0].SetPointer(puff, ATAG_OBJECT);
	if (numret > 1) ret[1].SetInt(acdmg), numret = 2;
	return numret;
}